

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O1

void RDL_deletePathIterator(RDL_pathIterator *it)

{
  int iVar1;
  RDL_lpStackElement *element;
  
  if (it->compressed_path != (uchar *)0x0) {
    free(it->compressed_path);
  }
  while( true ) {
    iVar1 = RDL_stack_empty(it->stack);
    if (iVar1 != 0) break;
    element = (RDL_lpStackElement *)RDL_stack_top(it->stack);
    RDL_lpStackElement_delete(element);
    RDL_stack_pop(it->stack);
  }
  RDL_stack_delete(it->stack);
  free(it);
  return;
}

Assistant:

static void RDL_deletePathIterator(RDL_pathIterator *it)
{
  RDL_lpStackElement *top;
  if (it->compressed_path) {
    free(it->compressed_path);
  }
  /* stack can be non-empty if premature terminating iteration */
  while (!RDL_stack_empty(it->stack)) {
    top = RDL_stack_top(it->stack);
    RDL_lpStackElement_delete(top);
    RDL_stack_pop(it->stack);
  }
  RDL_stack_delete(it->stack);
  free(it);
}